

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::descriptor_unittest::FeaturesDebugStringTest::LoadFile
          (FeaturesDebugStringTest *this,string_view name,string_view content)

{
  bool bVar1;
  Nullable<const_char_*> failure_msg;
  FileDescriptor *pFVar2;
  LogMessage *pLVar3;
  string_view v;
  FileDescriptor *local_2d0 [2];
  char *local_2c0;
  SimpleErrorCollector error_collector;
  Parser parser;
  ArrayInputStream input_stream;
  FileDescriptorProto proto;
  Tokenizer tokenizer;
  
  local_2c0 = content._M_str;
  io::ArrayInputStream::ArrayInputStream(&input_stream,local_2c0,(int)content._M_len,-1);
  error_collector.last_error_._M_dataplus._M_p = (pointer)&error_collector.last_error_.field_2;
  error_collector.super_ErrorCollector._vptr_ErrorCollector =
       (_func_int **)&PTR__SimpleErrorCollector_015fe658;
  error_collector.last_error_._M_string_length = 0;
  error_collector.last_error_.field_2._M_local_buf[0] = '\0';
  io::Tokenizer::Tokenizer
            (&tokenizer,&input_stream.super_ZeroCopyInputStream,
             &error_collector.super_ErrorCollector);
  compiler::Parser::Parser(&parser);
  parser.error_collector_ = &error_collector.super_ErrorCollector;
  FileDescriptorProto::FileDescriptorProto(&proto);
  bVar1 = compiler::Parser::Parse(&parser,&tokenizer,&proto);
  if (bVar1) {
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<char[1],std::__cxx11::string>
                            ((char (*) [1])(anon_var_dwarf_651463 + 5),&error_collector.last_error_,
                             "\"\" == error_collector.last_error()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
           proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
      if ((proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
        proto.super_Message.super_MessageLite._internal_metadata_.ptr_ =
             *(undefined8 *)
              (proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set
                (&proto.field_0._impl_.name_,name,
                 (Arena *)proto.super_Message.super_MessageLite._internal_metadata_.ptr_);
      local_2d0[0] = DescriptorPool::BuildFile(&this->roundtrip_pool_,&proto);
      pFVar2 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::FileDescriptor_const*>
                         ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                          ,0x2f0a,"roundtrip_pool_.BuildFile(proto)",local_2d0);
      FileDescriptorProto::~FileDescriptorProto(&proto);
      compiler::Parser::~Parser(&parser);
      io::Tokenizer::~Tokenizer(&tokenizer);
      SimpleErrorCollector::~SimpleErrorCollector(&error_collector);
      return pFVar2;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2f08,failure_msg);
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2f05,"parser.Parse(&tokenizer, &proto)");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       ((LogMessage *)local_2d0,&error_collector.last_error_);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,(char (*) [2])0xebf4e6)
    ;
    v._M_str = local_2c0;
    v._M_len = content._M_len;
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_2d0);
}

Assistant:

const FileDescriptor* LoadFile(absl::string_view name,
                                 absl::string_view content) {
    io::ArrayInputStream input_stream(content.data(), content.size());
    SimpleErrorCollector error_collector;
    io::Tokenizer tokenizer(&input_stream, &error_collector);
    compiler::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    FileDescriptorProto proto;
    ABSL_CHECK(parser.Parse(&tokenizer, &proto))
        << error_collector.last_error() << "\n"
        << content;
    ABSL_CHECK_EQ("", error_collector.last_error());
    proto.set_name(name);
    return ABSL_DIE_IF_NULL(roundtrip_pool_.BuildFile(proto));
  }